

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall
kj::MainBuilder::MainImpl::usageError(MainImpl *this,StringPtr programName,StringPtr message)

{
  ProcessContext *pPVar1;
  int iVar2;
  char (*in_stack_ffffffffffffffb0) [31];
  Array<char> local_48;
  char *local_30;
  size_t local_28;
  char *local_20;
  size_t local_18;
  
  local_18 = programName.content.size_;
  local_20 = programName.content.ptr;
  local_28 = message.content.size_;
  local_30 = message.content.ptr;
  pPVar1 = ((this->impl).ptr)->context;
  str<kj::StringPtr&,char_const(&)[3],kj::StringPtr&,char_const(&)[7],kj::StringPtr&,char_const(&)[31]>
            ((String *)&local_48,(kj *)&local_20,(StringPtr *)0x28b644,(char (*) [3])&local_30,
             (StringPtr *)"\nTry \'",(char (*) [7])&local_20,
             (StringPtr *)" --help\' for more information.",in_stack_ffffffffffffffb0);
  if (local_48.size_ == 0) {
    local_48.ptr = "";
  }
  iVar2 = (*pPVar1->_vptr_ProcessContext[4])
                    (pPVar1,local_48.ptr,local_48.size_ + (local_48.size_ == 0));
  Array<char>::~Array(&local_48);
  _Unwind_Resume(iVar2);
}

Assistant:

void MainBuilder::MainImpl::usageError(StringPtr programName, StringPtr message) {
  impl->context.exitError(kj::str(
      programName, ": ", message,
      "\nTry '", programName, " --help' for more information."));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}